

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageMultisampleTest::LoopTestOverS<unsigned_char,true,3u>
          (StorageMultisampleTest *this,bool skip_rgb)

{
  bool bVar1;
  bool bVar2;
  GLuint GVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined7 in_register_00000031;
  
  GVar3 = PrepareProgram(this,s_fragment_shader_ms_3D_fdecl_lowp,s_fragment_shader_tail_3D);
  this->m_po_ms = GVar3;
  GVar3 = PrepareProgram(this,s_fragment_shader_aux_3D_fdecl_lowp,s_fragment_shader_tail_3D);
  this->m_po_aux = GVar3;
  bVar1 = Test<unsigned_char,1,true,3u>(this);
  bVar2 = Test<unsigned_char,2,true,3u>(this);
  bVar2 = bVar2 && bVar1;
  if ((int)CONCAT71(in_register_00000031,skip_rgb) == 0) {
    bVar1 = Test<unsigned_char,3,true,3u>(this);
    bVar2 = bVar2 && bVar1;
  }
  bVar1 = Test<unsigned_char,4,true,3u>(this);
  CleanPrograms(this);
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  do {
    iVar5 = (**(code **)(CONCAT44(extraout_var,iVar4) + 0x800))();
  } while (iVar5 != 0);
  return (bool)(bVar2 & bVar1);
}

Assistant:

bool StorageMultisampleTest::LoopTestOverS(bool skip_rgb)
{
	/* Prepare one program to create multisample texture and one to copy it to regular texture. */
	m_po_ms  = PrepareProgram(FragmentShaderDeclarationMultisample<T, N, D>(), FragmentShaderTail<D>());
	m_po_aux = PrepareProgram(FragmentShaderDeclarationAuxiliary<T, N, D>(), FragmentShaderTail<D>());

	/* Run tests. */
	bool result = true;

	result &= Test<T, 1, N, D>();

	result &= Test<T, 2, N, D>();

	if (!skip_rgb)
	{
		result &= Test<T, 3, N, D>();
	}

	result &= Test<T, 4, N, D>();

	/* Cleanup.*/
	CleanPrograms();
	CleanErrors();

	/* Pass result. */
	return result;
}